

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# application.cpp
# Opt level: O0

string * __thiscall
cppcms::application::translate_abi_cxx11_(application *this,char *single,char *plural,int n)

{
  basic_message<char> *in_RDI;
  int in_stack_ffffffffffffff1c;
  basic_message<char> *this_00;
  locale local_b0 [24];
  application *in_stack_ffffffffffffff68;
  
  this_00 = in_RDI;
  booster::locale::translate<char>((char *)in_RDI,(char *)in_RDI,in_stack_ffffffffffffff1c);
  context(in_stack_ffffffffffffff68);
  http::context::locale((context *)this_00);
  booster::locale::basic_message<char>::str_abi_cxx11_(this_00,(locale *)in_RDI);
  std::locale::~locale(local_b0);
  booster::locale::basic_message<char>::~basic_message(in_RDI);
  return (string *)this_00;
}

Assistant:

std::string application::translate(char const *single,char const *plural,int n)
{
	return booster::locale::translate(single,plural,n).str(context().locale());
}